

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::PrepareVisitor::internalVisit(PrepareVisitor *this,RigidBody *rb)

{
  bool bVar1;
  StuntDouble *in_RSI;
  allocator<char> *in_RDI;
  iterator atomIter;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> myAtoms;
  shared_ptr<OpenMD::AtomData> atomData;
  shared_ptr<OpenMD::GenericData> data;
  RigidBody *in_stack_fffffffffffffe58;
  StuntDouble *in_stack_fffffffffffffe60;
  StuntDouble *in_stack_fffffffffffffe68;
  StuntDouble *this_00;
  shared_ptr<OpenMD::GenericData> *__r;
  StuntDouble *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_129 [56];
  undefined1 local_f1 [56];
  allocator<char> local_b9;
  string local_b8 [55];
  allocator<char> local_81;
  string local_80 [8];
  Atom *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_50 [8];
  StuntDouble *local_10;
  
  local_10 = in_RSI;
  std::shared_ptr<OpenMD::GenericData>::shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34def1);
  std::shared_ptr<OpenMD::AtomData>::shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34defe);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)0x34df0b);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(local_50);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_81;
  __s = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,in_RDI);
  StuntDouble::getPropertyByName(in_stack_fffffffffffffe68,(string *)in_stack_fffffffffffffe60);
  std::shared_ptr<OpenMD::GenericData>::operator=
            ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffe60,
             (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34df90);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffe60,
                          in_stack_fffffffffffffe58);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,in_RDI);
    StuntDouble::removeProperty(in_stack_fffffffffffffe60,(string *)in_stack_fffffffffffffe58);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  __r = (shared_ptr<OpenMD::GenericData> *)local_f1;
  this_00 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,in_RDI);
  StuntDouble::getPropertyByName(in_stack_fffffffffffffe68,(string *)in_stack_fffffffffffffe60);
  std::shared_ptr<OpenMD::GenericData>::operator=
            ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffe60,
             (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34e13b);
  std::__cxx11::string::~string((string *)(local_f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffe60,
                          in_stack_fffffffffffffe58);
  if (bVar1) {
    std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>(__r);
    std::shared_ptr<OpenMD::AtomData>::operator=
              ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffe60,
               (shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffe58);
    std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34e1a6);
    bVar1 = std::operator!=((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffe60,
                            in_stack_fffffffffffffe58);
    if (bVar1) {
      in_stack_fffffffffffffe68 = (StuntDouble *)local_129;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,in_RDI);
      StuntDouble::removeProperty(local_10,(string *)in_stack_fffffffffffffe58);
      std::__cxx11::string::~string((string *)(local_129 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_129);
      in_stack_fffffffffffffe60 = local_10;
    }
  }
  RigidBody::getAtoms(in_stack_fffffffffffffe58);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator=
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)this_00,
             (vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)in_stack_fffffffffffffe68);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)this_00);
  local_50[0]._M_current =
       (Atom **)std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::begin
                          ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                           in_stack_fffffffffffffe58);
  while( true ) {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)in_stack_fffffffffffffe58)
    ;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::operator*(local_50);
    internalVisit((PrepareVisitor *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::operator++(local_50);
  }
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)this_00);
  std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34e38e);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34e39b);
  return;
}

Assistant:

void PrepareVisitor::internalVisit(RigidBody* rb) {
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::vector<Atom*> myAtoms;
    std::vector<Atom*>::iterator atomIter;

    // if visited property is  existed, remove it
    data = rb->getPropertyByName("VISITED");

    if (data != nullptr) { rb->removeProperty("VISITED"); }

    // remove atomdata
    data = rb->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData != NULL) rb->removeProperty("ATOMDATA");
    }

    myAtoms = rb->getAtoms();

    for (atomIter = myAtoms.begin(); atomIter != myAtoms.end(); ++atomIter)
      internalVisit(*atomIter);
  }